

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Nullable<CordRep_*> absl::lts_20250127::VerifyTree(Nullable<CordRep_*> node)

{
  CordRep *root;
  ulong uVar1;
  size_t sVar2;
  byte bVar3;
  reference ppCVar4;
  CordRepFlat *this;
  size_t sVar5;
  CordRepExternal *pCVar6;
  CordRepCrc *pCVar7;
  CordRepSubstring *pCVar8;
  Nonnull<CordRep_*> in_RCX;
  string local_80;
  string death_message;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  worklist;
  Nullable<CordRep_*> local_28;
  
  if (node != (Nullable<CordRep_*>)0x0) {
    worklist.storage_.metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          )(Storage<unsigned_long,_1UL,_false>)0x0;
    local_28 = node;
    inlined_vector_internal::
    Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
    ::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
              ((Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                *)&worklist,&local_28);
    do {
      ppCVar4 = InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                ::back(&worklist);
      root = *ppCVar4;
      InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
      ::pop_back(&worklist);
      if (root == (CordRep *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&death_message,"Check node != nullptr failed: ",
                   (allocator<char> *)&local_80);
        ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,(Nonnull<CordRep_*>)0x0,in_RCX);
        std::__cxx11::string::append((string *)&death_message);
        std::__cxx11::string::~string((string *)&local_80);
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                   ,0x5f3,&death_message);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x5f3,
                      "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)");
      }
      if (root == node) {
        bVar3 = root->tag;
      }
      else {
        if (root->length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&death_message,"Check node->length != 0 failed: ",
                     (allocator<char> *)&local_80);
          ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::append((string *)&death_message);
          std::__cxx11::string::~string((string *)&local_80);
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f5,&death_message);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f5,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
        bVar3 = root->tag;
        if (bVar3 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&death_message,"Check !node->IsCrc() failed: ",
                     (allocator<char> *)&local_80);
          ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::append((string *)&death_message);
          std::__cxx11::string::~string((string *)&local_80);
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f6,&death_message);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f6,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      if (bVar3 < 6) {
        if (bVar3 == 1) {
          pCVar8 = cord_internal::CordRep::substring(root);
          uVar1 = pCVar8->start;
          pCVar8 = cord_internal::CordRep::substring(root);
          if (pCVar8->child->length <= uVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&death_message,
                       "Check node->substring()->start < node->substring()->child->length failed: ",
                       (allocator<char> *)&local_80);
            ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
            std::__cxx11::string::append((string *)&death_message);
            std::__cxx11::string::~string((string *)&local_80);
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                       ,0x602,&death_message);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                          ,0x602,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
          pCVar8 = cord_internal::CordRep::substring(root);
          sVar5 = root->length;
          sVar2 = pCVar8->start;
          pCVar8 = cord_internal::CordRep::substring(root);
          if (pCVar8->child->length < sVar5 + sVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&death_message,
                       "Check node->substring()->start + node->length <= node->substring()->child->length failed: "
                       ,(allocator<char> *)&local_80);
            ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
            std::__cxx11::string::append((string *)&death_message);
            std::__cxx11::string::~string((string *)&local_80);
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                       ,0x605,&death_message);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                          ,0x605,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
        }
        else if (bVar3 == 2) {
          pCVar7 = cord_internal::CordRep::crc(root);
          if (pCVar7->child == (CordRep *)0x0) {
            pCVar7 = cord_internal::CordRep::crc(root);
            if ((pCVar7->super_CordRep).length != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&death_message,
                         "Check node->crc()->child != nullptr || node->crc()->length == 0 failed: ",
                         (allocator<char> *)&local_80);
              ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
              std::__cxx11::string::append((string *)&death_message);
              std::__cxx11::string::~string((string *)&local_80);
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                         ,0x609,&death_message);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                            ,0x609,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
          }
          pCVar7 = cord_internal::CordRep::crc(root);
          if (pCVar7->child != (CordRep *)0x0) {
            pCVar7 = cord_internal::CordRep::crc(root);
            sVar5 = (pCVar7->super_CordRep).length;
            pCVar7 = cord_internal::CordRep::crc(root);
            if (sVar5 != pCVar7->child->length) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&death_message,
                         "Check node->crc()->length == node->crc()->child->length failed: ",
                         (allocator<char> *)&local_80);
              ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
              std::__cxx11::string::append((string *)&death_message);
              std::__cxx11::string::~string((string *)&local_80);
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                         ,0x60c,&death_message);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                            ,0x60c,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
            pCVar7 = cord_internal::CordRep::crc(root);
            inlined_vector_internal::
            Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
            ::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
                      ((Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                        *)&worklist,&pCVar7->child);
          }
        }
        else if (bVar3 == 5) {
          pCVar6 = cord_internal::CordRep::external(root);
          if (pCVar6->base == (char *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&death_message,"Check node->external()->base != nullptr failed: ",
                       (allocator<char> *)&local_80);
            ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
            std::__cxx11::string::append((string *)&death_message);
            std::__cxx11::string::~string((string *)&local_80);
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                       ,0x5fe,&death_message);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                          ,0x5fe,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
        }
      }
      else {
        uVar1 = root->length;
        this = cord_internal::CordRep::flat(root);
        sVar5 = cord_internal::CordRepFlat::Capacity(this);
        if (sVar5 < uVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&death_message,
                     "Check node->length <= node->flat()->Capacity() failed: ",
                     (allocator<char> *)&local_80);
          ReportError_abi_cxx11_(&local_80,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::append((string *)&death_message);
          std::__cxx11::string::~string((string *)&local_80);
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fb,&death_message);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fb,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
    } while (1 < (ulong)worklist.storage_.metadata_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                        .super_Storage<unsigned_long,_1UL,_false>.value);
    inlined_vector_internal::
    Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
    ::~Storage(&worklist.storage_);
  }
  return node;
}

Assistant:

static inline absl::Nullable<CordRep*> VerifyTree(
    absl::Nullable<CordRep*> node) {
  assert(node == nullptr || VerifyNode(node, node));
  static_cast<void>(&VerifyNode);
  return node;
}